

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_arg.hpp
# Opt level: O1

void __thiscall Args::MultiArg::process(MultiArg *this,Context *context)

{
  bool bVar1;
  int iVar2;
  undefined8 *puVar3;
  long *plVar4;
  size_type *psVar5;
  ulong uVar6;
  long *local_a0;
  undefined8 local_98;
  long local_90;
  undefined8 uStack_88;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  String local_40;
  
  iVar2 = (*(this->super_Arg).super_ArgIface._vptr_ArgIface[4])();
  if ((char)iVar2 == '\0') {
    (this->super_Arg).m_isDefined = true;
    this->m_count = this->m_count + 1;
    return;
  }
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Argument \"","");
  (*(this->super_Arg).super_ArgIface._vptr_ArgIface[3])(&local_80,this);
  uVar6 = 0xf;
  if (local_60 != local_50) {
    uVar6 = local_50[0];
  }
  if (uVar6 < (ulong)(local_78 + local_58)) {
    uVar6 = 0xf;
    if (local_80 != local_70) {
      uVar6 = local_70[0];
    }
    if ((ulong)(local_78 + local_58) <= uVar6) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_60);
      goto LAB_0013d353;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_80);
LAB_0013d353:
  local_a0 = &local_90;
  plVar4 = puVar3 + 2;
  if ((long *)*puVar3 == plVar4) {
    local_90 = *plVar4;
    uStack_88 = puVar3[3];
  }
  else {
    local_90 = *plVar4;
    local_a0 = (long *)*puVar3;
  }
  local_98 = puVar3[1];
  *puVar3 = plVar4;
  puVar3[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_a0);
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_40.field_2._M_allocated_capacity = *psVar5;
    local_40.field_2._8_8_ = plVar4[3];
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  }
  else {
    local_40.field_2._M_allocated_capacity = *psVar5;
    local_40._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_40._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  bVar1 = eatValues<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Args::CmdLine,Args::Context>
                    (context,&this->m_values,&local_40,(this->super_Arg).super_ArgIface.m_cmdLine);
  (this->super_Arg).m_isDefined = bVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  return;
}

Assistant:

inline void
MultiArg::process( Context & context )
{
	if( isWithValue() )
	{
		setDefined( eatValues( context, m_values,
			String( SL( "Argument \"" ) ) +
				name() + SL( "\" requires value that wasn't presented." ),
			cmdLine() ) );
	}
	else
	{
		setDefined( true );

		++m_count;
	}
}